

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::PrepareRead
          (ColumnReader *this,optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state)

{
  bool bVar1;
  runtime_error *prVar2;
  uint64_t len;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_208;
  PageHeader page_hdr;
  
  this->encoding = INVALID;
  ::std::__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::reset
            ((__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
             &this->defined_decoder,(pointer)0x0);
  this->page_is_filtered_out = false;
  ::std::__shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2> *)&this->block);
  duckdb_parquet::PageHeader::PageHeader(&page_hdr);
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_208,
               &(this->protocol->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  if (((ReadAheadBuffer *)
       (((ReadAheadBuffer *)((long)local_208._M_ptr + 0x20))->read_heads).
       super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
       super__List_node_base._M_next == (ReadAheadBuffer *)((long)local_208._M_ptr + 0x20)) &&
     ((((ReadAheadBuffer *)((long)local_208._M_ptr + 0x20))->merge_set)._M_t._M_impl.
      super__Rb_tree_header._M_node_count == 0)) {
    len = *(idx_t *)((long)local_208._M_ptr + 0x18) - *(idx_t *)((long)local_208._M_ptr + 0x10);
    if (0xff < len) {
      len = 0x100;
    }
    ThriftFileTransport::Prefetch
              ((ThriftFileTransport *)local_208._M_ptr,*(idx_t *)((long)local_208._M_ptr + 0x10),len
              );
    ParquetReader::Read(this->reader,
                        (TBase *)(&page_hdr.field_0x0 + *(long *)(page_hdr._0_8_ + -0x30)),
                        this->protocol);
    ThriftFileTransport::ClearPrefetch((ThriftFileTransport *)local_208._M_ptr);
  }
  else {
    ParquetReader::Read(this->reader,
                        (TBase *)(&page_hdr.field_0x0 + *(long *)(page_hdr._0_8_ + -0x30)),
                        this->protocol);
  }
  if ((page_hdr.compressed_page_size < 0) || (page_hdr.uncompressed_page_size < 0)) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar2,"Page sizes can\'t be < 0");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = PageIsFilteredOut(this,&page_hdr);
  if (bVar1) goto LAB_00dc280a;
  if (page_hdr.type == DATA_PAGE) {
    PreparePage(this,&page_hdr);
LAB_00dc27f1:
    PrepareDataPage(this,&page_hdr);
  }
  else if (page_hdr.type == DICTIONARY_PAGE) {
    PreparePage(this,&page_hdr);
    if ((long)page_hdr.dictionary_page_header.num_values < 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar2,"Invalid dictionary page header (num_values < 0)");
      __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    DictionaryDecoder::InitializeDictionary
              (&this->dictionary_decoder,(long)page_hdr.dictionary_page_header.num_values,filter,
               filter_state,this->column_schema->max_define != 0);
  }
  else if (page_hdr.type == DATA_PAGE_V2) {
    PreparePageV2(this,&page_hdr);
    goto LAB_00dc27f1;
  }
  (*this->_vptr_ColumnReader[0x12])(this);
LAB_00dc280a:
  duckdb_parquet::PageHeader::~PageHeader(&page_hdr);
  return;
}

Assistant:

void ColumnReader::PrepareRead(optional_ptr<const TableFilter> filter, optional_ptr<TableFilterState> filter_state) {
	encoding = ColumnEncoding::INVALID;
	defined_decoder.reset();
	page_is_filtered_out = false;
	block.reset();
	PageHeader page_hdr;
	auto &trans = reinterpret_cast<ThriftFileTransport &>(*protocol->getTransport());
	if (trans.HasPrefetch()) {
		// Already has some data prefetched, let's not mess with it
		reader.Read(page_hdr, *protocol);
	} else {
		// No prefetch yet, prefetch the full header in one go (so thrift won't read byte-by-byte from storage)
		// 256 bytes should cover almost all headers (unless it's a V2 header with really LONG string statistics)
		static constexpr idx_t ASSUMED_HEADER_SIZE = 256;
		const auto prefetch_size = MinValue(trans.GetSize() - trans.GetLocation(), ASSUMED_HEADER_SIZE);
		trans.Prefetch(trans.GetLocation(), prefetch_size);
		reader.Read(page_hdr, *protocol);
		trans.ClearPrefetch();
	}
	// some basic sanity check
	if (page_hdr.compressed_page_size < 0 || page_hdr.uncompressed_page_size < 0) {
		throw std::runtime_error("Page sizes can't be < 0");
	}

	if (PageIsFilteredOut(page_hdr)) {
		// this page has been filtered out so we don't need to read it
		return;
	}

	switch (page_hdr.type) {
	case PageType::DATA_PAGE_V2:
		PreparePageV2(page_hdr);
		PrepareDataPage(page_hdr);
		break;
	case PageType::DATA_PAGE:
		PreparePage(page_hdr);
		PrepareDataPage(page_hdr);
		break;
	case PageType::DICTIONARY_PAGE: {
		PreparePage(page_hdr);
		auto dictionary_size = page_hdr.dictionary_page_header.num_values;
		if (dictionary_size < 0) {
			throw std::runtime_error("Invalid dictionary page header (num_values < 0)");
		}
		dictionary_decoder.InitializeDictionary(dictionary_size, filter, filter_state, HasDefines());
		break;
	}
	default:
		break; // ignore INDEX page type and any other custom extensions
	}
	ResetPage();
}